

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,void *param_3,undefined1 (*param_4) [64],
          undefined8 *param_5,void *param_6)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  SampledWavelengths lambda;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  SampledWavelengths lambda_02;
  bool bVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar13 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar25 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  SampledSpectrum SVar27;
  SampledSpectrum r;
  SampledSpectrum mfree;
  SampledSpectrum sig_s;
  SampledSpectrum sig_a;
  undefined1 auVar28 [16];
  undefined1 in_stack_fffffffffffffc28 [64];
  SampledSpectrum *sigma_s;
  SampledSpectrum *pSVar29;
  SampledSpectrum *mfp;
  SampledSpectrum *rhoEff;
  BSSRDFTable *t;
  undefined1 *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  Normal3f *in_stack_fffffffffffffc98;
  Vector3f *in_stack_fffffffffffffca0;
  Point3f *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  SampledSpectrum *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined1 local_328 [32];
  SpectrumTextureHandle *in_stack_fffffffffffffcf8;
  UniversalTextureEvaluator *in_stack_fffffffffffffd00;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 in_stack_fffffffffffffd20 [40];
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd68 [24];
  undefined1 auVar34 [16];
  undefined1 auVar33 [24];
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined1 local_208 [64];
  undefined1 local_1c0 [8];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  BSSRDFTable *pBStack_170;
  undefined1 local_168 [64];
  SampledSpectrum local_120;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [64];
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  undefined8 *local_20;
  undefined1 (*local_18) [64];
  void *local_10;
  ulong uVar26;
  
  auVar28 = in_stack_fffffffffffffc28._0_16_;
  local_28 = param_6;
  local_20 = param_5;
  local_18 = param_4;
  local_10 = param_3;
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6063a4);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6063b1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)((long)param_3 + 0x10));
  if ((bVar1) &&
     (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)((long)param_3 + 0x18)),
     bVar1)) {
    in_stack_fffffffffffffcb4 = *(undefined4 *)((long)param_3 + 8);
    in_stack_fffffffffffffca8 = (Point3f *)local_80;
    SpectrumTextureHandle::SpectrumTextureHandle(auVar28._8_8_,auVar28._0_8_);
    auVar2 = vmovdqu64_avx512f(*local_18);
    local_c8 = vmovdqu64_avx512f(auVar2);
    local_e8 = *local_20;
    uStack_e0 = local_20[1];
    uStack_d8 = local_20[2];
    uStack_d0 = local_20[3];
    auVar3 = vmovdqu64_avx512f(local_c8);
    auVar2 = vmovdqu64_avx512f(auVar3);
    auVar28 = auVar2._0_16_;
    auVar13 = ZEXT856(auVar3._8_8_);
    auVar25 = ZEXT856(param_2);
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffd48;
    ctx.dudx = (Float)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    auVar30 = in_stack_fffffffffffffd20._0_12_;
    auVar31 = in_stack_fffffffffffffd20._12_12_;
    auVar32 = in_stack_fffffffffffffd20._24_12_;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar30._0_4_;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar30._4_4_;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar30._8_4_;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar31._0_4_;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar31._4_4_;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar31._8_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar32._0_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar32._4_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar32._8_4_;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffd20._36_4_;
    ctx.dudy = (Float)(int)in_stack_fffffffffffffd50;
    ctx.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    ctx.dvdy = (Float)(int)in_stack_fffffffffffffd58;
    ctx.faceIndex = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    auVar34 = in_stack_fffffffffffffd68._8_16_;
    lambda.lambda.values[2] = (float)in_stack_fffffffffffffd68._0_4_;
    lambda.lambda.values[3] = (float)in_stack_fffffffffffffd68._4_4_;
    lambda.pdf.values[0] = (float)auVar34._0_4_;
    lambda.pdf.values[1] = (float)auVar34._4_4_;
    lambda.pdf.values[2] = (float)auVar34._8_4_;
    lambda.pdf.values[3] = (float)auVar34._12_4_;
    lambda.lambda.values[0] = (float)(int)in_stack_fffffffffffffd60;
    lambda.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    SVar27 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,ctx,lambda);
    auVar14._0_8_ = SVar27.values.values._8_8_;
    auVar14._8_56_ = auVar25;
    auVar2._0_8_ = SVar27.values.values._0_8_;
    auVar2._8_56_ = auVar13;
    auVar13 = (undefined1  [56])0x0;
    local_80._8_8_ = vmovlpd_avx(auVar2._0_16_);
    local_70 = vmovlpd_avx(auVar14._0_16_);
    SVar27 = pbrt::operator*(auVar28._12_4_,auVar28._0_8_);
    auVar15._0_8_ = SVar27.values.values._8_8_;
    auVar15._8_56_ = auVar25;
    auVar3._0_8_ = SVar27.values.values._0_8_;
    auVar3._8_56_ = auVar13;
    local_68 = vmovlpd_avx(auVar3._0_16_);
    local_60 = vmovlpd_avx(auVar15._0_16_);
    SVar27 = ClampZero(auVar28._8_8_);
    auVar16._0_8_ = SVar27.values.values._8_8_;
    auVar16._8_56_ = auVar25;
    uVar26 = auVar25._8_8_;
    auVar4._0_8_ = SVar27.values.values._0_8_;
    auVar4._8_56_ = auVar13;
    local_58 = vmovlpd_avx(auVar4._0_16_);
    uStack_50 = vmovlpd_avx(auVar16._0_16_);
    in_stack_fffffffffffffccc = *(undefined4 *)((long)param_3 + 8);
    in_stack_fffffffffffffcc0 = &local_120;
    local_38 = local_58;
    uStack_30 = uStack_50;
    SpectrumTextureHandle::SpectrumTextureHandle(auVar28._8_8_,auVar28._0_8_);
    auVar2 = vmovdqu64_avx512f(*local_18);
    local_168 = vmovdqu64_avx512f(auVar2);
    local_188 = *local_20;
    uStack_180 = local_20[1];
    uStack_178 = local_20[2];
    t = (BSSRDFTable *)local_20[3];
    auVar3 = vmovdqu64_avx512f(local_168);
    auVar2 = vmovdqu64_avx512f(auVar3);
    auVar28 = auVar2._8_16_;
    auVar13 = ZEXT856(auVar3._8_8_);
    auVar25 = ZEXT856(uVar26);
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffd48;
    ctx_00.dudx = (Float)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    auVar30 = in_stack_fffffffffffffd20._0_12_;
    auVar31 = in_stack_fffffffffffffd20._12_12_;
    auVar32 = in_stack_fffffffffffffd20._24_12_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar30._0_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar30._4_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar30._8_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar31._0_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar31._4_4_;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar31._8_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar32._0_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar32._4_4_;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar32._8_4_;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffd20._36_4_;
    ctx_00.dudy = (Float)(int)in_stack_fffffffffffffd50;
    ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    ctx_00.dvdy = (Float)(int)in_stack_fffffffffffffd58;
    ctx_00.faceIndex = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    auVar34 = in_stack_fffffffffffffd68._8_16_;
    lambda_00.lambda.values[2] = (float)in_stack_fffffffffffffd68._0_4_;
    lambda_00.lambda.values[3] = (float)in_stack_fffffffffffffd68._4_4_;
    lambda_00.pdf.values[0] = (float)auVar34._0_4_;
    lambda_00.pdf.values[1] = (float)auVar34._4_4_;
    lambda_00.pdf.values[2] = (float)auVar34._8_4_;
    lambda_00.pdf.values[3] = (float)auVar34._12_4_;
    lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffffd60;
    lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    pBStack_170 = t;
    SVar27 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,ctx_00,lambda_00);
    pSVar29 = auVar28._8_8_;
    auVar17._0_8_ = SVar27.values.values._8_8_;
    auVar17._8_56_ = auVar25;
    auVar5._0_8_ = SVar27.values.values._0_8_;
    auVar5._8_56_ = auVar13;
    auVar13 = (undefined1  [56])0x0;
    local_120.values.values._8_8_ = vmovlpd_avx(auVar5._0_16_);
    local_110 = vmovlpd_avx(auVar17._0_16_);
    SVar27 = pbrt::operator*(auVar28._12_4_,auVar28._0_8_);
    auVar18._0_8_ = SVar27.values.values._8_8_;
    auVar18._8_56_ = auVar25;
    auVar6._0_8_ = SVar27.values.values._0_8_;
    auVar6._8_56_ = auVar13;
    local_108 = vmovlpd_avx(auVar6._0_16_);
    local_100 = vmovlpd_avx(auVar18._0_16_);
    SVar27 = ClampZero(pSVar29);
    auVar19._0_8_ = SVar27.values.values._8_8_;
    auVar19._8_56_ = auVar25;
    auVar7._0_8_ = SVar27.values.values._0_8_;
    auVar7._8_56_ = auVar13;
    local_f8 = vmovlpd_avx(auVar7._0_16_);
    local_f0 = vmovlpd_avx(auVar19._0_16_);
    local_48 = local_f8;
    local_40 = local_f0;
  }
  else {
    in_stack_fffffffffffffc94 = *(undefined4 *)((long)param_3 + 8);
    in_stack_fffffffffffffc88 = local_1c0;
    SpectrumTextureHandle::SpectrumTextureHandle(auVar28._8_8_,auVar28._0_8_);
    auVar2 = vmovdqu64_avx512f(*local_18);
    local_208 = vmovdqu64_avx512f(auVar2);
    local_228 = *local_20;
    uStack_220 = local_20[1];
    uStack_218 = local_20[2];
    uStack_210 = local_20[3];
    auVar3 = vmovdqu64_avx512f(local_208);
    auVar2 = vmovdqu64_avx512f(auVar3);
    auVar28 = auVar2._0_16_;
    in_stack_fffffffffffffc98 = (Normal3f *)&stack0xffffffffffffffff;
    auVar13 = ZEXT856(auVar3._8_8_);
    auVar25 = ZEXT856(param_2);
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffd48;
    ctx_01.dudx = (Float)(int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    auVar30 = in_stack_fffffffffffffd20._0_12_;
    auVar31 = in_stack_fffffffffffffd20._12_12_;
    auVar32 = in_stack_fffffffffffffd20._24_12_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar30._0_4_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar30._4_4_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar30._8_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar31._0_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar31._4_4_;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar31._8_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar32._0_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar32._4_4_;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar32._8_4_;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffd20._36_4_;
    ctx_01.dudy = (Float)(int)in_stack_fffffffffffffd50;
    ctx_01.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    ctx_01.dvdy = (Float)(int)in_stack_fffffffffffffd58;
    ctx_01.faceIndex = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    auVar34 = in_stack_fffffffffffffd68._8_16_;
    lambda_01.lambda.values[2] = (float)in_stack_fffffffffffffd68._0_4_;
    lambda_01.lambda.values[3] = (float)in_stack_fffffffffffffd68._4_4_;
    lambda_01.pdf.values[0] = (float)auVar34._0_4_;
    lambda_01.pdf.values[1] = (float)auVar34._4_4_;
    lambda_01.pdf.values[2] = (float)auVar34._8_4_;
    lambda_01.pdf.values[3] = (float)auVar34._12_4_;
    lambda_01.lambda.values[0] = (float)(int)in_stack_fffffffffffffd60;
    lambda_01.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    SVar27 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,ctx_01,lambda_01);
    auVar20._0_8_ = SVar27.values.values._8_8_;
    auVar20._8_56_ = auVar25;
    auVar8._0_8_ = SVar27.values.values._0_8_;
    auVar8._8_56_ = auVar13;
    auVar13 = (undefined1  [56])0x0;
    local_1b8 = vmovlpd_avx(auVar8._0_16_);
    local_1b0 = vmovlpd_avx(auVar20._0_16_);
    SVar27 = pbrt::operator*(auVar28._12_4_,auVar28._0_8_);
    auVar21._0_8_ = SVar27.values.values._8_8_;
    auVar21._8_56_ = auVar25;
    auVar9._0_8_ = SVar27.values.values._0_8_;
    auVar9._8_56_ = auVar13;
    local_1a8 = vmovlpd_avx(auVar9._0_16_);
    local_1a0 = vmovlpd_avx(auVar21._0_16_);
    SVar27 = ClampZero(auVar28._8_8_);
    auVar22._0_8_ = SVar27.values.values._8_8_;
    auVar22._8_56_ = auVar25;
    uVar26 = auVar25._8_8_;
    auVar10._0_8_ = SVar27.values.values._0_8_;
    auVar10._8_56_ = auVar13;
    local_198 = vmovlpd_avx(auVar10._0_16_);
    local_190 = vmovlpd_avx(auVar22._0_16_);
    in_stack_fffffffffffffca0 = (Vector3f *)local_250;
    SpectrumTextureHandle::SpectrumTextureHandle(auVar28._8_8_,auVar28._0_8_);
    auVar2 = vmovdqu64_avx512f(*local_18);
    auVar2 = vmovdqu64_avx512f(auVar2);
    auVar33 = auVar2._0_24_;
    pSVar29 = (SampledSpectrum *)*local_20;
    mfp = (SampledSpectrum *)local_20[1];
    rhoEff = (SampledSpectrum *)local_20[2];
    t = (BSSRDFTable *)local_20[3];
    auVar3 = vmovdqu64_avx512f(auVar2);
    auVar2 = vmovdqu64_avx512f(auVar3);
    auVar13 = ZEXT856(auVar3._8_8_);
    auVar25 = ZEXT856(uVar26);
    ctx_02._40_8_ = pSVar29;
    auVar30 = in_stack_fffffffffffffd20._0_12_;
    auVar31 = in_stack_fffffffffffffd20._12_12_;
    auVar32 = in_stack_fffffffffffffd20._24_12_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar30._0_4_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar30._4_4_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar30._8_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar31._0_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar31._4_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar31._8_4_;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar32._0_4_;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar32._4_4_;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar32._8_4_;
    ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffd20._36_4_;
    ctx_02._48_8_ = mfp;
    ctx_02._56_8_ = rhoEff;
    auVar28 = auVar33._8_16_;
    lambda_02.lambda.values[2] = (float)auVar33._0_4_;
    lambda_02.lambda.values[3] = (float)auVar33._4_4_;
    lambda_02.pdf.values[0] = (float)auVar28._0_4_;
    lambda_02.pdf.values[1] = (float)auVar28._4_4_;
    lambda_02.pdf.values[2] = (float)auVar28._8_4_;
    lambda_02.pdf.values[3] = (float)auVar28._12_4_;
    lambda_02.lambda.values._0_8_ = t;
    SVar27 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,ctx_02,lambda_02);
    sigma_s = auVar2._56_8_;
    auVar23._0_8_ = SVar27.values.values._8_8_;
    auVar23._8_56_ = auVar25;
    auVar11._0_8_ = SVar27.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    local_250._8_8_ = vmovlpd_avx(auVar11._0_16_);
    local_240 = vmovlpd_avx(auVar23._0_16_);
    SVar27 = Clamp<int,int>(auVar2._8_8_,auVar2._4_4_,auVar2._0_4_);
    auVar24._0_8_ = SVar27.values.values._8_8_;
    auVar24._8_56_ = auVar25;
    auVar12._0_8_ = SVar27.values.values._0_8_;
    auVar12._8_56_ = auVar13;
    local_238 = vmovlpd_avx(auVar12._0_16_);
    local_230 = vmovlpd_avx(auVar24._0_16_);
    SubsurfaceFromDiffuse(t,rhoEff,mfp,pSVar29,sigma_s);
  }
  TabulatedBSSRDF::TabulatedBSSRDF
            ((TabulatedBSSRDF *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             (Vector3f *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (Float)((ulong)in_stack_fffffffffffffc88 >> 0x20),SUB84(in_stack_fffffffffffffc88,0),
             (SampledSpectrum *)t,in_stack_fffffffffffffcc0,
             (BSSRDFTable *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  memcpy(local_28,local_328,0x70);
  return;
}

Assistant:

PBRT_CPU_GPU void GetBSSRDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                                SampledWavelengths &lambda,
                                TabulatedBSSRDF *bssrdf) const {
        SampledSpectrum sig_a, sig_s;
        if (sigma_a && sigma_s) {
            // Evaluate textures for $\sigma_\roman{a}$ and $\sigma_\roman{s}$
            sig_a = ClampZero(scale * texEval(sigma_a, ctx, lambda));
            sig_s = ClampZero(scale * texEval(sigma_s, ctx, lambda));

        } else {
            // Compute _sig_a_ and _sig_s_ from reflectance and mfp
            DCHECK(reflectance && mfp);
            SampledSpectrum mfree = ClampZero(scale * texEval(mfp, ctx, lambda));
            SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
            SubsurfaceFromDiffuse(table, r, mfree, &sig_a, &sig_s);
        }
        *bssrdf = TabulatedBSSRDF(ctx.p, ctx.dpdus, ctx.ns, ctx.wo, 0 /* FIXME: si.time*/,
                                  eta, sig_a, sig_s, &table);
    }